

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O2

string * fineftp::Filesystem::cleanPathNative(string *__return_storage_ptr__,string *path)

{
  cleanPath(__return_storage_ptr__,path,false,'/');
  return __return_storage_ptr__;
}

Assistant:

std::string cleanPathNative(const std::string& path)
  {
#ifdef WIN32
    bool windows_path = true;
    char separator = '\\';
#else // WIN32
    bool windows_path = false;
    char separator = '/';
#endif // WIN32
    return cleanPath(path, windows_path, separator);
  }